

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCore.c
# Opt level: O0

Aig_Man_t * Dch_ComputeChoices(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  abctime aVar6;
  Dch_Man_t *p_00;
  abctime aVar7;
  Dch_Cla_t *pDVar8;
  abctime aVar9;
  Aig_Man_t *p_01;
  abctime clkTotal;
  abctime clk;
  Aig_Man_t *pResult;
  Dch_Man_t *p;
  Dch_Pars_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  aVar6 = Abc_Clock();
  Aig_ManRandom(1);
  p_00 = Dch_ManCreate(pAig,pPars);
  aVar7 = Abc_Clock();
  pDVar8 = Dch_CreateCandEquivClasses(pAig,pPars->nWords,pPars->fVerbose);
  p_00->ppClasses = pDVar8;
  aVar9 = Abc_Clock();
  p_00->timeSimInit = aVar9 - aVar7;
  iVar1 = Dch_ClassesLitNum(p_00->ppClasses);
  p_00->nLits = iVar1;
  Dch_ManSweep(p_00);
  aVar7 = Abc_Clock();
  p_00->timeTotal = aVar7 - aVar6;
  Dch_ManStop(p_00);
  if (pAig->pTable != (Aig_Obj_t **)0x0) {
    free(pAig->pTable);
    pAig->pTable = (Aig_Obj_t **)0x0;
  }
  p_01 = Dch_DeriveChoiceAig(pAig,pPars->fSkipRedSupp);
  if (pPars->fVerbose != 0) {
    uVar2 = Aig_ManNodeNum(pAig);
    uVar3 = Aig_ManNodeNum(p_01);
    uVar4 = Dch_DeriveChoiceCountReprs(pAig);
    uVar5 = Dch_DeriveChoiceCountEquivs(p_01);
    iVar1 = Aig_ManChoiceNum(p_01);
    Abc_Print(1,"STATS:  Ands:%8d  ->%8d.  Reprs:%7d  ->%7d.  Choices =%7d.\n",(ulong)uVar2,
              (ulong)uVar3,(ulong)uVar4,(ulong)uVar5,iVar1);
  }
  return p_01;
}

Assistant:

Aig_Man_t * Dch_ComputeChoices( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
    Dch_Man_t * p;
    Aig_Man_t * pResult;
    abctime clk, clkTotal = Abc_Clock();
    // reset random numbers
    Aig_ManRandom(1);
    // start the choicing manager
    p = Dch_ManCreate( pAig, pPars );
    // compute candidate equivalence classes
clk = Abc_Clock(); 
    p->ppClasses = Dch_CreateCandEquivClasses( pAig, pPars->nWords, pPars->fVerbose );
p->timeSimInit = Abc_Clock() - clk;
//    Dch_ClassesPrint( p->ppClasses, 0 );
    p->nLits = Dch_ClassesLitNum( p->ppClasses );
    // perform SAT sweeping
    Dch_ManSweep( p );
    // free memory ahead of time
p->timeTotal = Abc_Clock() - clkTotal;
    Dch_ManStop( p );
    // create choices
    ABC_FREE( pAig->pTable );
    pResult = Dch_DeriveChoiceAig( pAig, pPars->fSkipRedSupp );
    // count the number of representatives
    if ( pPars->fVerbose ) 
        Abc_Print( 1, "STATS:  Ands:%8d  ->%8d.  Reprs:%7d  ->%7d.  Choices =%7d.\n", 
               Aig_ManNodeNum(pAig), 
               Aig_ManNodeNum(pResult), 
               Dch_DeriveChoiceCountReprs( pAig ),
               Dch_DeriveChoiceCountEquivs( pResult ),
               Aig_ManChoiceNum( pResult ) );
    return pResult;
}